

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

uchar * stbi__load_and_postprocess_8bit(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int *in_RCX;
  int *in_RDX;
  stbi__context *in_RSI;
  undefined4 in_R8D;
  int unaff_retaddr;
  int channels;
  void *result;
  stbi__result_info ri;
  int in_stack_000007d4;
  int in_stack_000007d8;
  int in_stack_000007dc;
  void *in_stack_000007e0;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffbc;
  stbi__result_info *in_stack_ffffffffffffffc0;
  int local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  stbi_uc *local_8;
  
  local_8 = (stbi_uc *)
            stbi__load_main(in_RSI,in_RDX,in_RCX,(int *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,unaff_retaddr);
  if (local_8 == (stbi_uc *)0x0) {
    local_8 = (stbi_uc *)0x0;
  }
  else {
    if (local_38 != 8) {
      if (local_38 != 0x10) {
        __assert_fail("ri.bits_per_channel == 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                      ,0x42a,
                      "unsigned char *stbi__load_and_postprocess_8bit(stbi__context *, int *, int *, int *, int)"
                     );
      }
      local_8 = stbi__convert_16_to_8
                          ((stbi__uint16 *)CONCAT44(in_stack_ffffffffffffffbc,*in_RDX),in_RSI->img_x
                           ,in_stack_ffffffffffffffb0,(int)((ulong)local_8 >> 0x20));
    }
    if (stbi__vertically_flip_on_load != 0) {
      stbi__vertical_flip(in_stack_000007e0,in_stack_000007dc,in_stack_000007d8,in_stack_000007d4);
    }
  }
  return local_8;
}

Assistant:

static unsigned char *stbi__load_and_postprocess_8bit(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   stbi__result_info ri;
   void *result = stbi__load_main(s, x, y, comp, req_comp, &ri, 8);

   if (result == NULL)
      return NULL;

   if (ri.bits_per_channel != 8) {
      STBI_ASSERT(ri.bits_per_channel == 16);
      result = stbi__convert_16_to_8((stbi__uint16 *) result, *x, *y, req_comp == 0 ? *comp : req_comp);
      ri.bits_per_channel = 8;
   }

   // @TODO: move stbi__convert_format to here

   if (stbi__vertically_flip_on_load) {
      int channels = req_comp ? req_comp : *comp;
      stbi__vertical_flip(result, *x, *y, channels * sizeof(stbi_uc));
   }

   return (unsigned char *) result;
}